

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::ScrollToBringRectIntoView(ImGuiWindow *window,ImRect *item_rect)

{
  bool bVar1;
  ImVec2 in_RSI;
  ImGuiWindow *in_RDI;
  ImVec2 next_scroll;
  ImRect window_rect;
  ImGuiContext *g;
  ImVec2 delta_scroll;
  ImVec2 *in_stack_ffffffffffffff38;
  float fVar2;
  ImVec2 *lhs;
  ImGuiWindow *in_stack_ffffffffffffff40;
  ImGuiWindow *window_00;
  ImVec2 local_88;
  ImVec2 local_80;
  ImRect local_78;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  undefined1 local_40 [8];
  ImVec2 local_38;
  ImRect local_30;
  ImVec2 item_rect_00;
  ImVec2 local_8;
  
  window_00 = (ImGuiWindow *)local_40;
  item_rect_00 = (ImVec2)GImGui;
  ImVec2::ImVec2((ImVec2 *)window_00,1.0,1.0);
  local_38 = ::operator-(in_stack_ffffffffffffff38,(ImVec2 *)0x32ce5b);
  ImVec2::ImVec2(&local_50,1.0,1.0);
  local_48 = ::operator+(in_stack_ffffffffffffff38,(ImVec2 *)0x32ce9e);
  ImRect::ImRect(&local_30,&local_38,&local_48);
  ImVec2::ImVec2(&local_8);
  bVar1 = ImRect::Contains(&local_30,(ImRect *)in_RSI);
  if (!bVar1) {
    if (((in_RDI->ScrollbarX & 1U) == 0) || (local_30.Min.x <= *(float *)in_RSI)) {
      if (((in_RDI->ScrollbarX & 1U) != 0) && (local_30.Max.x <= ((ImVec2 *)((long)in_RSI + 8))->x))
      {
        SetScrollFromPosX(in_RDI,(((ImVec2 *)((long)in_RSI + 8))->x - (in_RDI->Pos).x) +
                                 ((ImVec2 *)((long)item_rect_00 + 0x15a8))->x,1.0);
      }
    }
    else {
      SetScrollFromPosX(in_RDI,(*(float *)in_RSI - (in_RDI->Pos).x) -
                               ((ImVec2 *)((long)item_rect_00 + 0x15a8))->x,0.0);
    }
    fVar2 = (float)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    if (local_30.Min.y <= *(float *)((long)in_RSI + 4)) {
      if (local_30.Max.y <= *(float *)((long)in_RSI + 0xc)) {
        SetScrollFromPosY(in_stack_ffffffffffffff40,fVar2,SUB84(in_stack_ffffffffffffff38,0));
      }
    }
    else {
      SetScrollFromPosY(in_stack_ffffffffffffff40,fVar2,SUB84(in_stack_ffffffffffffff38,0));
    }
    local_58 = CalcNextScrollFromScrollTargetAndClamp(window_00);
    local_60 = ::operator-(in_stack_ffffffffffffff38,(ImVec2 *)0x32d095);
    local_8 = local_60;
  }
  if ((in_RDI->Flags & 0x1000000U) != 0) {
    lhs = &local_8;
    local_80 = ::operator-(lhs,(ImVec2 *)0x32d0ee);
    local_88 = ::operator-(lhs,(ImVec2 *)0x32d109);
    ImRect::ImRect(&local_78,&local_80,&local_88);
    local_68 = ScrollToBringRectIntoView((ImGuiWindow *)in_RSI,(ImRect *)item_rect_00);
    operator+=(&local_8,&local_68);
  }
  return local_8;
}

Assistant:

ImVec2 ImGui::ScrollToBringRectIntoView(ImGuiWindow* window, const ImRect& item_rect)
{
    ImGuiContext& g = *GImGui;
    ImRect window_rect(window->InnerRect.Min - ImVec2(1, 1), window->InnerRect.Max + ImVec2(1, 1));
    //GetForegroundDrawList(window)->AddRect(window_rect.Min, window_rect.Max, IM_COL32_WHITE); // [DEBUG]

    ImVec2 delta_scroll;
    if (!window_rect.Contains(item_rect))
    {
        if (window->ScrollbarX && item_rect.Min.x < window_rect.Min.x)
            SetScrollFromPosX(window, item_rect.Min.x - window->Pos.x - g.Style.ItemSpacing.x, 0.0f);
        else if (window->ScrollbarX && item_rect.Max.x >= window_rect.Max.x)
            SetScrollFromPosX(window, item_rect.Max.x - window->Pos.x + g.Style.ItemSpacing.x, 1.0f);
        if (item_rect.Min.y < window_rect.Min.y)
            SetScrollFromPosY(window, item_rect.Min.y - window->Pos.y - g.Style.ItemSpacing.y, 0.0f);
        else if (item_rect.Max.y >= window_rect.Max.y)
            SetScrollFromPosY(window, item_rect.Max.y - window->Pos.y + g.Style.ItemSpacing.y, 1.0f);

        ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
        delta_scroll = next_scroll - window->Scroll;
    }

    // Also scroll parent window to keep us into view if necessary
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        delta_scroll += ScrollToBringRectIntoView(window->ParentWindow, ImRect(item_rect.Min - delta_scroll, item_rect.Max - delta_scroll));

    return delta_scroll;
}